

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printc.cc
# Opt level: O0

void __thiscall PrintC::pushAnnotation(PrintC *this,Varnode *vn,PcodeOp *op)

{
  Translate *pTVar1;
  OpCode OVar2;
  int4 iVar3;
  uint uVar4;
  uint4 ws;
  BlockBasic *this_00;
  Funcdata *this_01;
  ScopeLocal *this_02;
  Varnode *pVVar5;
  uintb uVar6;
  UserPcodeOp *this_03;
  UserPcodeOp *this_04;
  Address *pAVar7;
  Address *pAVar8;
  Symbol *pSVar9;
  uintb uVar10;
  AddrSpace *pAVar11;
  ulong uVar12;
  Atom local_b8;
  Datatype *local_80;
  Datatype *ct;
  string regname;
  SymbolEntry *pSStack_50;
  int4 symboloff;
  SymbolEntry *entry;
  Varnode *outvn;
  VolatileReadOp *vr_op;
  VolatileWriteOp *vw_op;
  int4 userind;
  int4 size;
  Scope *scope;
  PcodeOp *op_local;
  Varnode *vn_local;
  PrintC *this_local;
  
  this_00 = PcodeOp::getParent(op);
  this_01 = BlockBasic::getFuncdata(this_00);
  this_02 = Funcdata::getScopeLocal(this_01);
  vw_op._4_4_ = 0;
  OVar2 = PcodeOp::code(op);
  if (OVar2 == CPUI_CALLOTHER) {
    pVVar5 = PcodeOp::getIn(op,0);
    uVar6 = Varnode::getOffset(pVVar5);
    this_03 = (UserPcodeOp *)
              UserOpManage::getVolatileWrite(&((this->super_PrintLanguage).glb)->userops);
    this_04 = (UserPcodeOp *)
              UserOpManage::getVolatileRead(&((this->super_PrintLanguage).glb)->userops);
    iVar3 = UserPcodeOp::getIndex(this_03);
    if ((int)uVar6 == iVar3) {
      pVVar5 = PcodeOp::getIn(op,2);
      vw_op._4_4_ = Varnode::getSize(pVVar5);
    }
    else {
      iVar3 = UserPcodeOp::getIndex(this_04);
      if ((int)uVar6 == iVar3) {
        pVVar5 = PcodeOp::getOut(op);
        if (pVVar5 == (Varnode *)0x0) {
          vw_op._4_4_ = 1;
        }
        else {
          pVVar5 = PcodeOp::getOut(op);
          vw_op._4_4_ = Varnode::getSize(pVVar5);
        }
      }
    }
  }
  if (vw_op._4_4_ == 0) {
    pAVar7 = Varnode::getAddr(vn);
    pAVar8 = PcodeOp::getAddr(op);
    pSStack_50 = Scope::queryContainer((Scope *)this_02,pAVar7,1,pAVar8);
    if (pSStack_50 == (SymbolEntry *)0x0) {
      vw_op._4_4_ = Varnode::getSize(vn);
    }
    else {
      vw_op._4_4_ = SymbolEntry::getSize(pSStack_50);
    }
  }
  else {
    pAVar7 = Varnode::getAddr(vn);
    pAVar8 = PcodeOp::getAddr(op);
    pSStack_50 = Scope::queryContainer((Scope *)this_02,pAVar7,vw_op._4_4_,pAVar8);
  }
  if (pSStack_50 == (SymbolEntry *)0x0) {
    pTVar1 = ((this->super_PrintLanguage).glb)->translate;
    pAVar11 = Varnode::getSpace(vn);
    uVar6 = Varnode::getOffset(vn);
    (*(pTVar1->super_AddrSpaceManager)._vptr_AddrSpaceManager[8])
              (&ct,pTVar1,pAVar11,uVar6,(ulong)vw_op._4_4_);
    uVar12 = std::__cxx11::string::empty();
    if ((uVar12 & 1) == 0) {
      PrintLanguage::Atom::Atom(&local_b8,(string *)&ct,vartoken,var_color,op,vn);
      PrintLanguage::pushAtom(&this->super_PrintLanguage,&local_b8);
    }
    else {
      local_80 = TypeFactory::getBase
                           (((this->super_PrintLanguage).glb)->types,vw_op._4_4_,TYPE_UINT);
      uVar6 = Varnode::getOffset(vn);
      pAVar11 = Varnode::getSpace(vn);
      ws = AddrSpace::getWordSize(pAVar11);
      uVar6 = AddrSpace::byteToAddress(uVar6,ws);
      (*(this->super_PrintLanguage)._vptr_PrintLanguage[2])(this,uVar6,local_80,vn,op);
    }
    std::__cxx11::string::~string((string *)&ct);
  }
  else {
    uVar4 = SymbolEntry::getSize(pSStack_50);
    if (uVar4 == vw_op._4_4_) {
      pSVar9 = SymbolEntry::getSymbol(pSStack_50);
      (*(this->super_PrintLanguage)._vptr_PrintLanguage[5])(this,pSVar9,vn,op);
    }
    else {
      uVar6 = Varnode::getOffset(vn);
      uVar10 = SymbolEntry::getFirst(pSStack_50);
      pSVar9 = SymbolEntry::getSymbol(pSStack_50);
      (*(this->super_PrintLanguage)._vptr_PrintLanguage[7])
                (this,pSVar9,(ulong)(uint)((int)uVar6 - (int)uVar10),(ulong)vw_op._4_4_,vn,op,0);
    }
  }
  return;
}

Assistant:

void PrintC::pushAnnotation(const Varnode *vn,const PcodeOp *op)

{
  const Scope *scope = op->getParent()->getFuncdata()->getScopeLocal();
  int4 size = 0;
  if (op->code() == CPUI_CALLOTHER) {
  // This construction is for volatile CALLOTHERs where the input annotation is the original address
  // of the volatile access
    int4 userind = (int4)op->getIn(0)->getOffset();
    VolatileWriteOp *vw_op = glb->userops.getVolatileWrite();
    VolatileReadOp *vr_op = glb->userops.getVolatileRead();
    if (userind == vw_op->getIndex()) {	// Annotation from a volatile write
      size = op->getIn(2)->getSize(); // Get size from the 3rd parameter of write function
    }
    else if (userind == vr_op->getIndex()) {
      const Varnode *outvn = op->getOut();
      if (outvn != (const Varnode *)0)
	size = op->getOut()->getSize(); // Get size from output of read function
      else
	size = 1;
    }
  }
  SymbolEntry *entry;
  if (size != 0)
    entry = scope->queryContainer(vn->getAddr(),size,op->getAddr());
  else {
    entry = scope->queryContainer(vn->getAddr(),1,op->getAddr());
    if (entry != (SymbolEntry *)0)
      size = entry->getSize();
    else
      size = vn->getSize();
  }
  
  if (entry != (SymbolEntry *)0) {
    if (entry->getSize() == size)
      pushSymbol(entry->getSymbol(),vn,op);
    else {
      int4 symboloff = vn->getOffset() - entry->getFirst();
      pushPartialSymbol(entry->getSymbol(),symboloff,size,vn,op,(Datatype *)0);
    }
  }
  else {
    string regname = glb->translate->getRegisterName(vn->getSpace(),vn->getOffset(),size);
    if (regname.empty()) {
      Datatype *ct = glb->types->getBase(size,TYPE_UINT);
      pushConstant(AddrSpace::byteToAddress(vn->getOffset(),vn->getSpace()->getWordSize()),ct,vn,op);
    }
    else
      pushAtom(Atom(regname,vartoken,EmitXml::var_color,op,vn));
  }
}